

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drawing.cpp
# Opt level: O3

void QtMWidgets::drawSliderHandle
               (QPainter *p,QRect *r,int xRadius,int yRadius,QColor *borderColor,QColor *lightColor)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  QColor QVar9;
  QLinearGradient g;
  QPointF local_c8;
  double local_b8;
  double dStack_b0;
  undefined1 local_a8 [16];
  double local_98;
  double dStack_90;
  QPointF local_48;
  
  QPainter::setPen((QColor *)p);
  QBrush::QBrush((QBrush *)local_a8,lightColor,SolidPattern);
  QPainter::setBrush((QBrush *)p);
  QBrush::~QBrush((QBrush *)local_a8);
  uVar1 = r->x1;
  uVar5 = r->y1;
  local_a8._0_8_ = (undefined8)(int)uVar1;
  local_a8._8_8_ = (undefined8)(int)uVar5;
  uVar2 = r->x2;
  uVar6 = r->y2;
  local_98 = (double)((uVar2 - uVar1) + 1);
  dStack_90 = (double)((uVar6 - uVar5) + 1);
  QPainter::drawRoundedRect((QRectF *)p,(double)xRadius,(double)yRadius,(SizeMode)local_a8);
  local_c8.xp = 0.0;
  local_c8.yp = 0.0;
  local_48.xp._0_4_ = 0;
  local_48.xp._4_4_ = 0;
  local_48.yp._0_4_ = 0;
  local_48.yp._4_4_ = 0x3ff00000;
  QLinearGradient::QLinearGradient((QLinearGradient *)local_a8,&local_c8,&local_48);
  QGradient::setCoordinateMode((CoordinateMode)(QLinearGradient *)local_a8);
  QVar9 = darkerColor(lightColor,0x4b);
  local_c8.xp = QVar9._0_8_;
  local_c8.yp._0_6_ = QVar9.ct._4_6_;
  QGradient::setColorAt(0.0,(QColor *)local_a8);
  QVar9 = darkerColor(lightColor,10);
  local_c8.xp = QVar9._0_8_;
  local_c8.yp._0_6_ = QVar9.ct._4_6_;
  QGradient::setColorAt(1.0,(QColor *)local_a8);
  QPainter::setPen((PenStyle)p);
  QBrush::QBrush((QBrush *)&local_c8,(QGradient *)local_a8);
  QPainter::setBrush((QBrush *)p);
  QBrush::~QBrush((QBrush *)&local_c8);
  uVar3 = r->x1;
  uVar7 = r->y1;
  local_c8.xp = (qreal)(uVar3 + 2);
  local_c8.yp = (qreal)(uVar7 + 2);
  uVar4 = r->x2;
  uVar8 = r->y2;
  local_b8 = (double)((uVar4 - uVar3) + -3);
  dStack_b0 = (double)((uVar8 - uVar7) + -3);
  QPainter::drawRoundedRect
            ((QRectF *)p,(double)(xRadius + -4),(double)(yRadius + -4),(SizeMode)&local_c8);
  QLinearGradient::~QLinearGradient((QLinearGradient *)local_a8);
  return;
}

Assistant:

void drawSliderHandle( QPainter * p, const QRect & r,
	int xRadius, int yRadius, const QColor & borderColor,
	const QColor & lightColor )
{
	p->setPen( borderColor );
	p->setBrush( lightColor );
	p->drawRoundedRect( r, xRadius, yRadius );

	QLinearGradient g( QPointF( 0.0, 0.0 ), QPointF( 0.0, 1.0 ) );
	g.setCoordinateMode( QGradient::ObjectBoundingMode );
	g.setColorAt( 0.0, darkerColor( lightColor, 75 ) );
	g.setColorAt( 1.0, darkerColor( lightColor, 10 ) );

	p->setPen( Qt::NoPen );
	p->setBrush( g );

	p->drawRoundedRect( r.marginsRemoved( QMargins( 2, 2, 2, 2 ) ),
		xRadius - 4, yRadius - 4 );
}